

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMemoryAllocation.h
# Opt level: O2

bool okResize<unsigned_char>
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *use_vector,HighsInt dimension
               ,uchar value)

{
  uchar local_9;
  
  local_9 = value;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (use_vector,(long)dimension,&local_9);
  return true;
}

Assistant:

bool okResize(std::vector<T>& use_vector, HighsInt dimension, T value = T{}) {
  try {
    use_vector.resize(dimension, value);
  } catch (const std::bad_alloc& e) {
    printf("HighsMemoryAllocation::okResize fails with %s\n", e.what());
    return false;
  }
  return true;
}